

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O3

bool __thiscall OPLmusicBlock::ServiceStream(OPLmusicBlock *this,void *buff,int numbytes)

{
  ulong *puVar1;
  byte bVar2;
  uint uVar3;
  OPLio *pOVar4;
  bool bVar5;
  int count;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  bVar2 = ((this->super_musicBlock).io)->IsOPL3 | this->FullPan;
  uVar9 = (ulong)(long)numbytes >> (bVar2 + 2 & 0x3f);
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->ChipAccess);
  if (0 < (int)uVar9) {
    bVar5 = false;
    do {
      dVar10 = this->NextTickIn;
      uVar3 = (uint)dVar10;
      uVar8 = (ulong)uVar3;
      if ((int)uVar9 < (int)uVar3) {
        uVar8 = uVar9 & 0xffffffff;
      }
      if (0 < (int)uVar3) {
        pOVar4 = (this->super_musicBlock).io;
        iVar7 = (int)uVar8;
        if (pOVar4->NumChips != 0) {
          uVar6 = 0;
          do {
            (*pOVar4->chips[uVar6]->_vptr_OPLEmul[4])(pOVar4->chips[uVar6],buff,uVar8);
            uVar6 = uVar6 + 1;
            pOVar4 = (this->super_musicBlock).io;
          } while (uVar6 < pOVar4->NumChips);
        }
        count = iVar7 << (bVar2 & 0x1f);
        OffsetSamples(this,(float *)buff,count);
        if (dVar10 != this->NextTickIn) {
          __assert_fail("NextTickIn == ticky",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                        ,0xf4,"bool OPLmusicBlock::ServiceStream(void *, int)");
        }
        dVar10 = this->NextTickIn - (double)iVar7;
        this->NextTickIn = dVar10;
        if (dVar10 < 0.0) {
          __assert_fail("NextTickIn >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                        ,0xf6,"bool OPLmusicBlock::ServiceStream(void *, int)");
        }
        uVar9 = (ulong)(uint)((int)uVar9 - iVar7);
        buff = (void *)((long)buff + (long)count * 4);
      }
      iVar7 = (int)uVar9;
      if (dVar10 < 1.0) {
        uVar3 = (*this->_vptr_OPLmusicBlock[3])(this);
        if ((int)uVar3 < 0) {
          __assert_fail("next >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                        ,0xfe,"bool OPLmusicBlock::ServiceStream(void *, int)");
        }
        if (uVar3 == 0) {
          if ((~this->Looping & 1U) != 0 || bVar5) {
            if (iVar7 < 1) {
              bVar5 = false;
            }
            else {
              pOVar4 = (this->super_musicBlock).io;
              if (pOVar4->NumChips != 0) {
                uVar8 = 0;
                do {
                  (*pOVar4->chips[uVar8]->_vptr_OPLEmul[4])
                            (pOVar4->chips[uVar8],buff,uVar9 & 0xffffffff);
                  uVar8 = uVar8 + 1;
                  pOVar4 = (this->super_musicBlock).io;
                } while (uVar8 < pOVar4->NumChips);
              }
              OffsetSamples(this,(float *)buff,iVar7 << (bVar2 & 0x1f));
              bVar5 = false;
            }
            goto LAB_00336899;
          }
          (*this->_vptr_OPLmusicBlock[2])(this);
          bVar5 = true;
        }
        else {
          pOVar4 = (this->super_musicBlock).io;
          (*pOVar4->_vptr_OPLio[6])(pOVar4,(ulong)uVar3);
          dVar10 = (double)(int)uVar3 * this->SamplesPerTick + this->NextTickIn;
          this->NextTickIn = dVar10;
          if (dVar10 < 0.0) {
            __assert_fail("NextTickIn >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                          ,0x11a,"bool OPLmusicBlock::ServiceStream(void *, int)");
          }
          puVar1 = &(this->super_musicBlock).MLtime;
          *puVar1 = *puVar1 + (ulong)uVar3;
          bVar5 = false;
        }
      }
    } while (0 < iVar7);
  }
  bVar5 = true;
LAB_00336899:
  FCriticalSection::Leave(&this->ChipAccess);
  return bVar5;
}

Assistant:

bool OPLmusicBlock::ServiceStream (void *buff, int numbytes)
{
	float *samples1 = (float *)buff;
	int stereoshift = (int)(FullPan | io->IsOPL3);
	int numsamples = numbytes / (sizeof(float) << stereoshift);
	bool prevEnded = false;
	bool res = true;

	memset(buff, 0, numbytes);

	ChipAccess.Enter();
	while (numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);
		size_t i;

		if (samplesleft > 0)
		{
			for (i = 0; i < io->NumChips; ++i)
			{
				io->chips[i]->Update(samples1, samplesleft);
			}
			OffsetSamples(samples1, samplesleft << stereoshift);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert (NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft << stereoshift;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (!Looping || prevEnded)
				{
					if (numsamples > 0)
					{
						for (i = 0; i < io->NumChips; ++i)
						{
							io->chips[i]->Update(samples1, numsamples);
						}
						OffsetSamples(samples1, numsamples << stereoshift);
					}
					res = false;
					break;
				}
				else
				{
					// Avoid infinite loops from songs that do nothing but end
					prevEnded = true;
					Restart ();
				}
			}
			else
			{
				prevEnded = false;
				io->WriteDelay(next);
				NextTickIn += SamplesPerTick * next;
				assert (NextTickIn >= 0);
				MLtime += next;
			}
		}
	}
	ChipAccess.Leave();
	return res;
}